

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_realloc.h
# Opt level: O2

void __thiscall
vector_realloc<unsigned_char_*,_16U>::push_back
          (vector_realloc<unsigned_char_*,_16U> *this,uchar **t)

{
  size_t sVar1;
  
  sVar1 = this->_size;
  if (sVar1 == this->_capacity) {
    grow(this);
    sVar1 = this->_size;
  }
  this->_data[sVar1] = *t;
  this->_size = sVar1 + 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (_size == _capacity) { grow(); }
		_data[_size] = t;
		++_size;
	}